

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularString::GenerateMessageClearingCode
          (SingularString *this,Printer *p)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  anon_class_1_0_00000001 local_f9;
  string local_f8;
  char *local_d8;
  Sub local_d0;
  
  if ((this->super_FieldGeneratorBase).is_oneof_ == true) {
    pcVar3 = "\n      $field_$.Destroy();\n    ";
    uVar2 = 0x1f;
  }
  else {
    if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
      bVar1 = protobuf::internal::cpp::HasHasbit((this->super_FieldGeneratorBase).field_);
      if (bVar1) {
        io::Printer::Emit(p,0,0,0x2a,"\n      $DCHK$(!$field_$.IsDefault());\n    ");
      }
    }
    if (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_ ==
        (string *)0x0) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Clear","");
      bVar1 = protobuf::internal::cpp::HasHasbit((this->super_FieldGeneratorBase).field_);
      local_d8 = "ClearToEmpty";
      if (bVar1) {
        local_d8 = "ClearNonDefaultToEmpty";
      }
      io::Printer::Sub::Sub<char_const*>(&local_d0,&local_f8,&local_d8);
      io::Printer::Emit(p,&local_d0,1,0x2b,"\n            $field_$.$Clear$();\n          ");
      if (local_d0.annotation_.
          super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
          _M_payload.
          super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
          .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged
          == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   &local_d0.annotation_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.value_.consume_after._M_dataplus._M_p !=
          &local_d0.value_.consume_after.field_2) {
        operator_delete(local_d0.value_.consume_after._M_dataplus._M_p,
                        local_d0.value_.consume_after.field_2._M_allocated_capacity + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr
        [local_d0.value_.value.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         _M_index]._M_data)(&local_f9,&local_d0.value_.value);
      local_d0.value_.value.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      _M_index = 0xff;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.key_._M_dataplus._M_p != &local_d0.key_.field_2) {
        operator_delete(local_d0.key_._M_dataplus._M_p,
                        local_d0.key_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    pcVar3 = "\n      $field_$.ClearToDefault($lazy_var$, GetArena());\n    ";
    uVar2 = 0x3c;
  }
  io::Printer::Emit(p,0,0,uVar2,pcVar3);
  return;
}

Assistant:

void SingularString::GenerateMessageClearingCode(io::Printer* p) const {
  if (is_oneof()) {
    p->Emit(R"cc(
      $field_$.Destroy();
    )cc");
    return;
  }

  // Two-dimension specialization here: supporting arenas, field presence, or
  // not, and default value is the empty string or not. Complexity here ensures
  // the minimal number of branches / amount of extraneous code at runtime
  // (given that the below methods are inlined one-liners)!

  // If we have a hasbit, then the Clear() method of the protocol buffer
  // will have checked that this field is set.  If so, we can avoid redundant
  // checks against the default variable.

  if (is_inlined() && HasHasbit(field_)) {
    // Calling mutable_$name$() gives us a string reference and sets the has bit
    // for $name$ (in proto2).  We may get here when the string field is inlined
    // but the string's contents have not been changed by the user, so we cannot
    // make an assertion about the contents of the string and could never make
    // an assertion about the string instance.
    //
    // For non-inlined strings, we distinguish from non-default by comparing
    // instances, rather than contents.
    p->Emit(R"cc(
      $DCHK$(!$field_$.IsDefault());
    )cc");
  }

  if (!EmptyDefault()) {
    // Clear to a non-empty default is more involved, as we try to use the
    // Arena if one is present and may need to reallocate the string.
    p->Emit(R"cc(
      $field_$.ClearToDefault($lazy_var$, GetArena());
    )cc");
    return;
  }

  p->Emit({{"Clear",
            HasHasbit(field_) ? "ClearNonDefaultToEmpty" : "ClearToEmpty"}},
          R"cc(
            $field_$.$Clear$();
          )cc");
}